

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall Compiler::instructionToBinary(Compiler *this,Instruction *ins)

{
  ostream *poVar1;
  bool bVar2;
  Operation OVar3;
  pointer ppVar4;
  Error *this_00;
  pair<int,_int> pVar5;
  undefined2 local_ee;
  pair<int,_int> pStack_ec;
  u2 local_e6;
  undefined2 local_e2;
  pair<int,_int> pStack_e0;
  u2 local_da;
  undefined2 local_d6;
  pair<int,_int> pStack_d4;
  u2 local_ce;
  undefined2 local_ca;
  pair<int,_int> pStack_c8;
  u2 local_c2;
  undefined2 local_be;
  pair<int,_int> pStack_bc;
  u2 local_b6;
  undefined2 local_b2;
  pair<int,_int> pStack_b0;
  u2 local_aa;
  undefined2 local_a6;
  pair<int,_int> pStack_a4;
  u2 local_9e;
  undefined2 local_9a;
  pair<int,_int> pStack_98;
  u2 local_92;
  undefined2 local_8e;
  pair<int,_int> pStack_8c;
  u2 local_86;
  int local_84;
  pair<int,_int> pStack_80;
  u4 param2;
  undefined2 local_76;
  int iStack_74;
  u2 param1;
  int local_6c;
  undefined1 local_65;
  u4 param;
  allocator<char> local_51;
  string local_50;
  _Self local_30;
  Operation local_24;
  _Self local_20;
  iterator it;
  Instruction *ins_local;
  Compiler *this_local;
  
  it._M_node = (_Base_ptr)ins;
  local_24 = Instruction::getOpr(ins);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<Operation,_char_*,_std::less<Operation>,_std::allocator<std::pair<const_Operation,_char_*>_>_>
       ::find(&ITCTable,&local_24);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<Operation,_char_*,_std::less<Operation>,_std::allocator<std::pair<const_Operation,_char_*>_>_>
       ::end(&ITCTable);
  bVar2 = std::operator!=(&local_20,&local_30);
  if (bVar2) {
    poVar1 = this->_wtr;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_Operation,_char_*>_>::operator->(&local_20);
    std::ostream::write((char *)poVar1,(long)ppVar4->second);
    OVar3 = Instruction::getOpr((Instruction *)it._M_node);
    switch(OVar3) {
    case ipush:
      _iStack_74 = Instruction::getParam((Instruction *)it._M_node);
      local_6c = iStack_74;
      writeNBytes(this,&local_6c,4);
      break;
    default:
      break;
    case loada:
      pStack_80 = Instruction::getParam((Instruction *)it._M_node);
      local_76 = (undefined2)pStack_80.first;
      writeNBytes(this,&local_76,2);
      pStack_8c = Instruction::getParam((Instruction *)it._M_node);
      local_84 = pStack_8c.second;
      writeNBytes(this,&local_84,4);
      break;
    case loadc:
      pStack_98 = Instruction::getParam((Instruction *)it._M_node);
      local_8e = (undefined2)pStack_98.first;
      writeNBytes(this,&local_8e,2);
      break;
    case call:
      pStack_a4 = Instruction::getParam((Instruction *)it._M_node);
      local_9a = (undefined2)pStack_a4.first;
      writeNBytes(this,&local_9a,2);
      break;
    case je:
      pStack_bc = Instruction::getParam((Instruction *)it._M_node);
      local_b2 = (undefined2)pStack_bc.first;
      writeNBytes(this,&local_b2,2);
      break;
    case jne:
      pStack_c8 = Instruction::getParam((Instruction *)it._M_node);
      local_be = (undefined2)pStack_c8.first;
      writeNBytes(this,&local_be,2);
      break;
    case jg:
      pStack_ec = Instruction::getParam((Instruction *)it._M_node);
      local_e2 = (undefined2)pStack_ec.first;
      writeNBytes(this,&local_e2,2);
      break;
    case jge:
      pVar5 = Instruction::getParam((Instruction *)it._M_node);
      local_ee = (undefined2)pVar5.first;
      writeNBytes(this,&local_ee,2);
      break;
    case jl:
      pStack_d4 = Instruction::getParam((Instruction *)it._M_node);
      local_ca = (undefined2)pStack_d4.first;
      writeNBytes(this,&local_ca,2);
      break;
    case jle:
      pStack_e0 = Instruction::getParam((Instruction *)it._M_node);
      local_d6 = (undefined2)pStack_e0.first;
      writeNBytes(this,&local_d6,2);
      break;
    case jmp:
      pStack_b0 = Instruction::getParam((Instruction *)it._M_node);
      local_a6 = (undefined2)pStack_b0.first;
      writeNBytes(this,&local_a6,2);
    }
    return;
  }
  local_65 = 1;
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Unvalid operation type",&local_51);
  Error::Error(this_00,&local_50);
  local_65 = 0;
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void Compiler::instructionToBinary(Instruction& ins) {
	if (auto it = ITCTable.find(ins.getOpr()); it != ITCTable.end()) {
		_wtr.write(it->second, 1);
	}
	else {
		throw Error("Unvalid operation type");
	}
	switch (ins.getOpr())
	{
	case Operation::ipush: {
		u4 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::loada: {
		u2 param1 = ins.getParam().first;
		writeNBytes(&param1, sizeof param1);
		u4 param2 = ins.getParam().second;
		writeNBytes(&param2, sizeof param2);
		break;
	}
	case Operation::loadc: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::call: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jmp: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::je: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jne: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jl: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jle: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jg: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jge: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	default:
		break;
	}
}